

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

LIBSSH2_SFTP * libssh2_sftp_init(LIBSSH2_SESSION *session)

{
  uint32_t *out;
  bool bVar1;
  uchar *puVar2;
  int iVar3;
  uint32_t uVar4;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar5;
  LIBSSH2_SFTP *sftp;
  ssize_t sVar6;
  size_t sVar7;
  char *pcVar8;
  uchar *buf_00;
  uchar *buf_01;
  LIBSSH2_SFTP **ppLVar9;
  uchar *data;
  size_t data_len;
  string_buf buf;
  size_t extname_len;
  uchar *extdata;
  uchar *extname;
  uchar *local_98;
  uchar *local_90;
  uchar *local_88;
  LIBSSH2_SFTP **local_80;
  size_t local_78;
  size_t local_70;
  string_buf local_68;
  long local_50;
  size_t local_48;
  uchar *local_40;
  uchar *local_38;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    if ((session->state & 8) != 0) {
      start_time = time((time_t *)0x0);
      ppLVar9 = &session->sftpInit_sftp;
      buf_00 = session->sftpInit_buffer;
      buf_01 = session->sftpInit_buffer + 5;
      do {
        local_70 = 0;
        if (session->sftpInit_state == libssh2_NB_state_idle) {
          if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
            __assert_fail("!session->sftpInit_sftp",
                          "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c"
                          ,0x324,"LIBSSH2_SFTP *sftp_init(LIBSSH2_SESSION *)");
          }
          session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
          session->sftpInit_state = libssh2_NB_state_created;
        }
        sftp = session->sftpInit_sftp;
        if (session->sftpInit_state == libssh2_NB_state_created) {
          pLVar5 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
          session->sftpInit_channel = pLVar5;
          if (pLVar5 != (LIBSSH2_CHANNEL *)0x0) {
            session->sftpInit_state = libssh2_NB_state_sent;
            goto LAB_001242ed;
          }
          iVar3 = libssh2_session_last_errno(session);
          if (iVar3 == -0x25) {
            pcVar8 = "Would block starting up channel";
            goto LAB_00124530;
          }
          _libssh2_error(session,-0x15,"Unable to startup channel");
LAB_00124562:
          session->sftpInit_state = libssh2_NB_state_idle;
        }
        else {
LAB_001242ed:
          if (session->sftpInit_state == libssh2_NB_state_sent) {
            iVar3 = _libssh2_channel_process_startup
                              (session->sftpInit_channel,"subsystem",9,"sftp",4);
            if (iVar3 == 0) {
              session->sftpInit_state = libssh2_NB_state_sent1;
              iVar3 = 0;
            }
            else if (iVar3 == -0x25) {
              _libssh2_error(session,-0x25,"Would block to request SFTP subsystem");
              iVar3 = 1;
            }
            else {
              _libssh2_error(session,-0x15,"Unable to request SFTP subsystem");
              iVar3 = 4;
            }
            if (iVar3 != 4) {
              if (iVar3 == 0) goto LAB_0012439d;
              goto LAB_0012464a;
            }
          }
          else {
LAB_0012439d:
            if (session->sftpInit_state == libssh2_NB_state_sent1) {
              iVar3 = _libssh2_channel_extended_data(session->sftpInit_channel,1);
              if (iVar3 == -0x25) {
                pcVar8 = "Would block requesting handle extended data";
                goto LAB_00124530;
              }
              sftp = (LIBSSH2_SFTP *)_libssh2_calloc(session,0x180);
              session->sftpInit_sftp = sftp;
              if (sftp != (LIBSSH2_SFTP *)0x0) {
                sftp->channel = session->sftpInit_channel;
                sftp->request_id = 0;
                _libssh2_htonu32(buf_00,5);
                session->sftpInit_buffer[4] = '\x01';
                _libssh2_htonu32(buf_01,3);
                session->sftpInit_sent = 0;
                session->sftpInit_state = libssh2_NB_state_sent2;
                goto LAB_0012443c;
              }
              iVar3 = -6;
              pcVar8 = "Unable to allocate a new SFTP structure";
            }
            else {
LAB_0012443c:
              if (session->sftpInit_state == libssh2_NB_state_sent2) {
                sVar6 = _libssh2_channel_write
                                  (session->sftpInit_channel,0,buf_00 + session->sftpInit_sent,
                                   9 - session->sftpInit_sent);
                if (sVar6 == -0x25) {
                  pcVar8 = "Would block sending SSH_FXP_INIT";
                  goto LAB_00124530;
                }
                if (sVar6 < 0) {
                  iVar3 = -7;
                  pcVar8 = "Unable to send SSH_FXP_INIT";
                  goto LAB_0012463b;
                }
                sVar7 = sVar6 + session->sftpInit_sent;
                session->sftpInit_sent = sVar7;
                if (sVar7 == 9) {
                  session->sftpInit_state = libssh2_NB_state_sent3;
                }
              }
              if (session->sftpInit_state == libssh2_NB_state_error_closing) {
                iVar3 = _libssh2_channel_free(session->sftpInit_channel);
                if (iVar3 != -0x25) {
                  session->sftpInit_channel = (LIBSSH2_CHANNEL *)0x0;
                  if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
                    (*session->free)(session->sftpInit_sftp,&session->abstract);
                    session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
                  }
                  goto LAB_00124562;
                }
                pcVar8 = "Would block closing channel";
LAB_00124530:
                _libssh2_error(session,-0x25,pcVar8);
                goto LAB_0012464a;
              }
              iVar3 = sftp_packet_require(sftp,'\x02',0,&local_98,&local_70,5);
              sVar7 = local_70;
              puVar2 = local_98;
              if (iVar3 == -0x26) {
                if (local_70 != 0) {
                  (*session->free)(local_98,&session->abstract);
                }
                iVar3 = -0x1f;
                pcVar8 = "Invalid SSH_FXP_VERSION response";
              }
              else {
                if (iVar3 == 0) {
                  local_68.data = local_98;
                  local_68.dataptr = local_98 + 1;
                  local_68.len = local_70;
                  out = &sftp->version;
                  local_90 = buf_01;
                  local_88 = buf_00;
                  local_80 = ppLVar9;
                  iVar3 = _libssh2_get_u32(&local_68,out);
                  if (iVar3 == 0) {
                    if (3 < *out) {
                      *out = 3;
                    }
                    do {
                      if (puVar2 + sVar7 <= local_68.dataptr) {
                        (*session->free)(local_98,&session->abstract);
                        ppLVar9 = local_80;
                        pLVar5 = sftp->channel;
                        pLVar5->abstract = sftp;
                        pLVar5->close_cb = libssh2_sftp_dtor;
                        session->sftpInit_state = libssh2_NB_state_idle;
                        *local_80 = (LIBSSH2_SFTP *)0x0;
                        local_80[1] = (LIBSSH2_SFTP *)0x0;
                        _libssh2_list_init(&sftp->sftp_handles);
                        buf_00 = local_88;
                        buf_01 = local_90;
                        goto LAB_0012464c;
                      }
                      iVar3 = _libssh2_get_string(&local_68,&local_38,&local_48);
                      if (iVar3 == 0) {
                        iVar3 = _libssh2_get_string(&local_68,&local_40,&local_78);
                        if (iVar3 != 0) {
                          (*session->free)(local_98,&session->abstract);
                          pcVar8 = "Data too short when extracting extdata";
                          goto LAB_0012470f;
                        }
                        uVar4 = 0;
                        if (local_78 == 0) {
LAB_001247b1:
                          if ((local_48 == 0x18) &&
                             (iVar3 = strncmp("posix-rename@openssh.com",(char *)local_38,0x18),
                             iVar3 == 0)) {
                            sftp->posix_rename_version = uVar4;
                          }
                          bVar1 = false;
                        }
                        else {
                          pcVar8 = (char *)(*session->alloc)(local_78 + 1,&session->abstract);
                          if (pcVar8 != (char *)0x0) {
                            memcpy(pcVar8,local_40,local_78);
                            pcVar8[local_78] = '\0';
                            local_50 = strtol(pcVar8,(char **)0x0,10);
                            (*session->free)(pcVar8,&session->abstract);
                            uVar4 = (uint32_t)local_50;
                            goto LAB_001247b1;
                          }
                          _libssh2_error(session,-6,
                                         "Unable to allocate memory for SSH_FXP_VERSION packet");
                          bVar1 = true;
                        }
                      }
                      else {
                        (*session->free)(local_98,&session->abstract);
                        pcVar8 = "Data too short when extracting extname";
LAB_0012470f:
                        _libssh2_error(session,-0x26,pcVar8);
                        bVar1 = true;
                      }
                    } while (!bVar1);
                    buf_00 = local_88;
                    buf_01 = local_90;
                    ppLVar9 = local_80;
                    if (!bVar1) goto LAB_0012464a;
                  }
                  else {
                    (*session->free)(local_98,&session->abstract);
                    _libssh2_error(session,-0x26,"Data too short when extracting version");
                    buf_00 = local_88;
                    buf_01 = local_90;
                    ppLVar9 = local_80;
                  }
                  goto LAB_00124640;
                }
                if (iVar3 == -0x25) {
                  pcVar8 = "Would block receiving SSH_FXP_VERSION";
                  goto LAB_00124530;
                }
                pcVar8 = "Timeout waiting for response from SFTP subsystem";
              }
            }
LAB_0012463b:
            _libssh2_error(session,iVar3,pcVar8);
          }
LAB_00124640:
          session->sftpInit_state = libssh2_NB_state_error_closing;
        }
LAB_0012464a:
        sftp = (LIBSSH2_SFTP *)0x0;
LAB_0012464c:
        if (session->api_block_mode == 0) {
          return sftp;
        }
        if (sftp != (LIBSSH2_SFTP *)0x0) {
          return sftp;
        }
        iVar3 = libssh2_session_last_errno(session);
        if (iVar3 != -0x25) {
          return (LIBSSH2_SFTP *)0x0;
        }
        iVar3 = _libssh2_wait_socket(session,start_time);
        if (iVar3 != 0) {
          return (LIBSSH2_SFTP *)0x0;
        }
      } while( true );
    }
    _libssh2_error(session,-0x22,"session not authenticated yet");
  }
  return (LIBSSH2_SFTP *)0x0;
}

Assistant:

LIBSSH2_API LIBSSH2_SFTP *libssh2_sftp_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_SFTP *ptr;

    if(!session)
        return NULL;

    if(!(session->state & LIBSSH2_STATE_AUTHENTICATED)) {
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "session not authenticated yet");
        return NULL;
    }

    BLOCK_ADJUST_ERRNO(ptr, session, sftp_init(session));
    return ptr;
}